

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping.c
# Opt level: O1

int mpt_mapping_cmp(mpt_mapping *map,mpt_valsrc *src,int cli)

{
  uint uVar1;
  
  if (((cli < 0) || (uVar1 = 0xffffffff, (uint)map->client == cli)) &&
     (uVar1 = 0xfffffffe, (map->src).dim == src->dim)) {
    uVar1 = (uint)(((map->src).state & src->state) == 0);
  }
  return uVar1;
}

Assistant:

int mpt_mapping_cmp(const MPT_STRUCT(mapping) *map, const MPT_STRUCT(valsrc) *src, int cli)
{
	if (cli >= 0 && (map->client != cli)) {
		return -1;
	}
	if (map->src.dim != src->dim) {
		return -2;
	}
	if (map->src.state & src->state) {
		return 0;
	}
	return 1;
}